

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall module::listFilesRecursively(module *this,string *basePath,string *filename)

{
  int iVar1;
  char *pcVar2;
  DIR *__dirp;
  dirent *__lhs;
  string *in_RDX;
  module *in_RSI;
  long in_RDI;
  dirent *dp;
  string path;
  DIR *dir;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  module *__lhs_00;
  string local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  dirent *local_48;
  string local_40 [32];
  string *basePath_00;
  module *this_00;
  
  __lhs_00 = in_RSI;
  basePath_00 = in_RDX;
  this_00 = in_RSI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar2);
  if (__dirp != (DIR *)0x0) {
    std::__cxx11::string::string(local_40);
    while (__lhs = readdir(__dirp), local_48 = __lhs, __lhs != (dirent *)0x0) {
      iVar1 = strcmp(__lhs->d_name,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_48->d_name,".."), iVar1 != 0)) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_48->d_name;
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iVar1 = strcmp((char *)__rhs,pcVar2);
        if (iVar1 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         __rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_78);
          std::__cxx11::string::~string(local_78);
          std::__cxx11::string::~string(local_98);
          break;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       __rhs);
        pcVar2 = local_48->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,pcVar2,&local_f9);
        std::operator+(&__lhs_00->base_path,&in_RSI->base_path);
        in_stack_fffffffffffffe78 = local_40;
        in_stack_fffffffffffffe70 = local_b8;
        std::__cxx11::string::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        std::__cxx11::string::~string(in_stack_fffffffffffffe70);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::string(local_120,in_stack_fffffffffffffe78);
        std::__cxx11::string::string(local_140,in_RDX);
        listFilesRecursively(this_00,(string *)basePath_00,(string *)__dirp);
        std::__cxx11::string::~string(local_140);
        std::__cxx11::string::~string(local_120);
      }
    }
    closedir(__dirp);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void module::listFilesRecursively(std::string basePath, std::string filename)
{
    DIR *dir = opendir(basePath.c_str());
    if (!dir)
    {
        return;
    }

    std::string path;
    struct dirent *dp;
    while ((dp = readdir(dir)) != NULL)
    {
        if (strcmp(dp->d_name, ".") != 0 && strcmp(dp->d_name, "..") != 0)
        {
            if (strcmp(dp->d_name, filename.c_str()) == 0)
            {
                module_header = basePath + sepd + dp->d_name;
                break;
            }

            // Construct new path from our base path
            path = basePath + sepd + std::string(dp->d_name);

            listFilesRecursively(path, filename);
        }
    }

    closedir(dir);
}